

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeIndexedVector.h
# Opt level: O0

void __thiscall
slang::
SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
SafeIndexedVector(SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
                  *this)

{
  vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  *in_RDI;
  
  std::
  vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ::vector((vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
            *)0x548510);
  std::
  deque<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ::deque((deque<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
           *)0x548523);
  std::
  vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ::emplace_back<>(in_RDI);
  return;
}

Assistant:

SafeIndexedVector() {
        // reserve a slot for the invalid value
        storage.emplace_back();
    }